

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

int __thiscall QTreeView::sizeHintForColumn(QTreeView *this,int column)

{
  QTreeViewItem *pQVar1;
  byte bVar2;
  long lVar3;
  QTreeViewPrivate *this_00;
  int iVar4;
  uint firstVisual;
  uint uVar5;
  int iVar6;
  QWidget *pQVar7;
  int iVar8;
  undefined8 *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long in_FS_OFFSET;
  QModelIndex local_160;
  QModelIndex local_148;
  int offset;
  QArrayDataPointer<QTreeViewItem> local_120;
  QStyleOptionViewItem option;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
  if ((this_00->viewItems).d.size == 0) {
    iVar6 = -1;
LAB_0054790c:
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
      __stack_chk_fail();
    }
    return iVar6;
  }
  QWidget::ensurePolished((QWidget *)this);
  memset(&option,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&option);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(this,&option);
  local_120.d = (this_00->viewItems).d.d;
  local_120.ptr = (this_00->viewItems).d.ptr;
  lVar10 = (this_00->viewItems).d.size;
  if (local_120.d != (Data *)0x0) {
    LOCK();
    ((local_120.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_120.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120.size = lVar10;
  iVar4 = QHeaderView::resizeContentsPrecision(this_00->header);
  offset = 0;
  firstVisual = QTreeViewPrivate::firstVisibleItem(this_00,&offset);
  uVar5 = QTreeViewPrivate::lastVisibleItem(this_00,firstVisual,offset);
  iVar8 = (int)lVar10;
  if (((int)(uVar5 | firstVisual) < 0) || (lVar10 - 1U == (ulong)uVar5)) {
    uVar5 = iVar8 - 1;
    if (iVar4 < 0) {
      firstVisual = 0;
    }
    else if (iVar4 == 0) {
      firstVisual = 0;
      if (0 < (int)(iVar8 - 2U)) {
        firstVisual = iVar8 - 2U;
      }
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      for (iVar6 = ((pQVar7->data->crect).y2.m_i - (pQVar7->data->crect).y1.m_i) + 1;
          (firstVisual != 0 && (0 < iVar6)); iVar6 = iVar6 - iVar11) {
        iVar11 = QTreeViewPrivate::itemHeight(this_00,firstVisual);
        firstVisual = firstVisual - 1;
      }
    }
    else {
      firstVisual = 0;
      if (0 < (int)(uVar5 - iVar4)) {
        firstVisual = uVar5 - iVar4;
      }
    }
  }
  lVar10 = (long)(int)firstVisual;
  lVar14 = lVar10 * 0x28;
  iVar6 = 0;
  iVar11 = 0;
  for (; iVar12 = iVar11, lVar10 <= (int)uVar5; lVar10 = lVar10 + 1) {
    if (((&(local_120.ptr)->field_0x1c)[lVar14] & 2) == 0) {
      puVar9 = (undefined8 *)((long)&((local_120.ptr)->index).r + lVar14);
      local_148._0_8_ = *puVar9;
      local_148.i = puVar9[1];
      local_148.m.ptr = (QAbstractItemModel *)puVar9[2];
      QModelIndex::sibling(&local_160,&local_148,local_148.r,column);
      local_148.m.ptr = local_160.m.ptr;
      local_148.r = local_160.r;
      local_148.c = local_160.c;
      local_148.i = local_160.i;
      iVar6 = QTreeViewPrivate::widthHintForIndex(this_00,&local_148,iVar6,&option,(int)lVar10);
      iVar11 = iVar11 + 1;
      iVar12 = iVar4;
      if (iVar11 == iVar4) break;
    }
    lVar14 = lVar14 + 0x28;
  }
  uVar16 = (ulong)(uVar5 - 1);
  iVar8 = iVar8 + -1;
  if (iVar4 == 0) {
    iVar12 = iVar4;
  }
LAB_005477d1:
  do {
LAB_005477e8:
    iVar11 = (int)uVar16;
    if ((iVar12 == iVar4) || ((int)firstVisual < 1 && iVar8 <= iVar11)) {
      QArrayDataPointer<QTreeViewItem>::~QArrayDataPointer(&local_120);
      QStyleOptionViewItem::~QStyleOptionViewItem(&option);
      goto LAB_0054790c;
    }
    if (iVar11 != iVar8 && (0 < (int)firstVisual & (byte)iVar12) == 0) {
      pbVar13 = &local_120.ptr[(long)iVar11 + 1].field_0x1c;
      uVar16 = (long)iVar11;
      do {
        uVar15 = uVar16;
        uVar16 = uVar15;
        if ((long)iVar8 <= (long)uVar15) goto LAB_005477e8;
        uVar16 = uVar15 + 1;
        bVar2 = *pbVar13;
        pbVar13 = pbVar13 + 0x28;
      } while ((bVar2 & 2) != 0);
      if (-2 < (long)uVar15) {
        uVar5 = (uint)uVar16;
        break;
      }
      goto LAB_005477e8;
    }
    pbVar13 = &local_120.ptr[(ulong)firstVisual - 1].field_0x1c;
    while (0 < (int)firstVisual) {
      firstVisual = firstVisual - 1;
      bVar2 = *pbVar13;
      pbVar13 = pbVar13 + -0x28;
      uVar5 = firstVisual;
      if ((bVar2 & 2) == 0) goto LAB_00547868;
    }
  } while( true );
LAB_00547868:
  pQVar1 = local_120.ptr + uVar5;
  local_148.r = (pQVar1->index).r;
  local_148.c = (pQVar1->index).c;
  local_148.i = (pQVar1->index).i;
  local_148.m.ptr = local_120.ptr[uVar5].index.m.ptr;
  QModelIndex::sibling(&local_160,&local_148,local_148.r,column);
  local_148.m.ptr = local_160.m.ptr;
  local_148.r = local_160.r;
  local_148.c = local_160.c;
  local_148.i = local_160.i;
  iVar6 = QTreeViewPrivate::widthHintForIndex(this_00,&local_148,iVar6,&option,uVar5);
  iVar12 = iVar12 + 1;
  goto LAB_005477d1;
}

Assistant:

int QTreeView::sizeHintForColumn(int column) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return -1;
    ensurePolished();
    int w = 0;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QList<QTreeViewItem> viewItems = d->viewItems;

    const int maximumProcessRows = d->header->resizeContentsPrecision(); // To avoid this to take forever.

    int offset = 0;
    int start = d->firstVisibleItem(&offset);
    int end = d->lastVisibleItem(start, offset);
    if (start < 0 || end < 0 || end == viewItems.size() - 1) {
        end = viewItems.size() - 1;
        if (maximumProcessRows < 0) {
            start = 0;
        } else if (maximumProcessRows == 0) {
            start = qMax(0, end - 1);
            int remainingHeight = viewport()->height();
            while (start > 0 && remainingHeight > 0) {
                remainingHeight -= d->itemHeight(start);
                --start;
            }
        } else {
            start = qMax(0, end - maximumProcessRows);
        }
    }

    int rowsProcessed = 0;

    for (int i = start; i <= end; ++i) {
        if (viewItems.at(i).spanning)
            continue; // we have no good size hint
        QModelIndex index = viewItems.at(i).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, i);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    --end;
    int actualBottom = viewItems.size() - 1;

    if (maximumProcessRows == 0)
        rowsProcessed = 0; // skip the while loop

    while (rowsProcessed != maximumProcessRows && (start > 0 || end < actualBottom)) {
        int idx  = -1;

        if ((rowsProcessed % 2 && start > 0) || end == actualBottom) {
            while (start > 0) {
                --start;
                if (viewItems.at(start).spanning)
                    continue;
                idx = start;
                break;
            }
        } else {
            while (end < actualBottom) {
                ++end;
                if (viewItems.at(end).spanning)
                    continue;
                idx = end;
                break;
            }
        }
        if (idx < 0)
            continue;

        QModelIndex index = viewItems.at(idx).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, idx);
        ++rowsProcessed;
    }
    return w;
}